

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall
JetHead::Socket::setSelector(Socket *this,SocketListener *listener,Selector *selector)

{
  Selector *selector_local;
  SocketListener *listener_local;
  Socket *this_local;
  
  this->mListener = listener;
  if ((this->mConnected & 1U) == 0) {
    this->mSelector = selector;
  }
  else {
    if (this->mSelector != (Selector *)0x0) {
      Selector::removeListener(this->mSelector,this->mFd,&this->super_SelectorListener);
    }
    this->mSelector = selector;
    if ((this->mSelector != (Selector *)0x0) && (this->mListener != (SocketListener *)0x0)) {
      Selector::addListener(this->mSelector,this->mFd,1,&this->super_SelectorListener,0);
    }
  }
  return;
}

Assistant:

void Socket::setSelector( SocketListener *listener, Selector *selector )
{
	mListener = listener;
	if ( mConnected )
	{
		if ( mSelector != NULL )
			mSelector->removeListener( mFd, this );
		mSelector = selector;
		if ( mSelector != NULL and mListener != NULL )
		{
			mSelector->addListener( mFd, POLLIN, this );
		}
	}
	else
		mSelector = selector;		
}